

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O0

void add_elements(tree_element *elements,_Bool do_random)

{
  int iVar1;
  uint local_24;
  byte abStack_1e [2];
  uint32_t num;
  _Bool _Stack_18;
  _Bool _Stack_17;
  _Bool added [6];
  uint32_t i;
  _Bool do_random_local;
  tree_element *elements_local;
  
  added[5] = do_random;
  if (do_random) {
    _Stack_18 = false;
    _Stack_17 = false;
    added[0] = false;
    added[1] = false;
    for (; __Stack_18 < 6; __Stack_18 = __Stack_18 + 1) {
      abStack_1e[__Stack_18] = 0;
    }
    _Stack_18 = false;
    _Stack_17 = false;
    added[0] = false;
    added[1] = false;
    for (; __Stack_18 < 6; __Stack_18 = __Stack_18 + 1) {
      iVar1 = rand();
      local_24 = iVar1 % 6;
      while ((abStack_1e[local_24] & 1) != 0) {
        local_24 = (local_24 + 1) % 6;
      }
      elements[local_24].node.key = elements + local_24;
      avl_insert(&head,&elements[local_24].node);
      abStack_1e[local_24] = 1;
    }
  }
  else {
    _Stack_18 = false;
    _Stack_17 = false;
    added[0] = false;
    added[1] = false;
    for (; __Stack_18 < 6; __Stack_18 = __Stack_18 + 1) {
      elements[__Stack_18].node.key = elements + __Stack_18;
      avl_insert(&head,&elements[__Stack_18].node);
    }
  }
  return;
}

Assistant:

static void add_elements(struct tree_element *elements, bool do_random) {
  uint32_t i;
  bool added[COUNT];

  if (do_random) {
    for (i=0; i<COUNT; i++) {
      added[i] = false;
    }

    for (i=0; i<COUNT; i++) {
      uint32_t num = rand() % COUNT;

      while (added[num]) {
        num = (num + 1) % COUNT;
      }

      elements[num].node.key = &elements[num].value;
      avl_insert(&head, &elements[num].node);
      added[num] = true;
    }
  }
  else {
    for (i=0; i<COUNT; i++) {
      elements[i].node.key = &elements[i].value;
      avl_insert(&head, &elements[i].node);
    }
  }
}